

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

BaseState<false> * __thiscall
LabelObjectState<false>::EndObject
          (LabelObjectState<false> *this,Context<false> *ctx,SizeType param_2)

{
  float fVar1;
  float fVar2;
  shared_data *psVar3;
  
  if (this->found_cb == true) {
    v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&(ctx->ex->l).simple,&this->cb_label);
    this->found_cb = false;
    (this->cb_label).cost = 0.0;
    (this->cb_label).action = 0;
    (this->cb_label).probability = 0.0;
    (this->cb_label).partial_prediction = 0.0;
  }
  else if (this->found == true) {
    fVar1 = (ctx->ex->l).simple.label;
    if (((fVar1 != 3.4028235e+38) || (NAN(fVar1))) &&
       (psVar3 = ctx->all->sd, psVar3->is_more_than_two_labels_observed == false)) {
      fVar2 = psVar3->first_observed_label;
      if ((fVar2 != 3.4028235e+38) || (NAN(fVar2))) {
        if ((fVar2 != fVar1) || (NAN(fVar2) || NAN(fVar1))) {
          fVar2 = psVar3->second_observed_label;
          if ((fVar2 != 3.4028235e+38) || (NAN(fVar2))) {
            if ((fVar2 != fVar1) || (NAN(fVar2) || NAN(fVar1))) {
              psVar3->is_more_than_two_labels_observed = true;
            }
          }
          else {
            psVar3->second_observed_label = fVar1;
          }
        }
      }
      else {
        psVar3->first_observed_label = fVar1;
      }
    }
    this->found = false;
  }
  return this->return_state;
}

Assistant:

BaseState<audit>* EndObject(Context<audit>& ctx, rapidjson::SizeType)
  {
    if (found_cb)
    {
      CB::label* ld = (CB::label*)&ctx.ex->l;
      ld->costs.push_back(cb_label);

      found_cb = false;
      cb_label = {0., 0, 0., 0.};
    }
    else if (found)
    {
      count_label(ctx.all->sd, ctx.ex->l.simple.label);

      found = false;
    }

    return return_state;
  }